

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O0

size_t __thiscall
avro::parsing::
ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>::skipMap
          (ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>
           *this)

{
  int iVar1;
  type pDVar2;
  undefined4 extraout_var;
  long in_RDI;
  size_t n;
  size_t in_stack_00000028;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_00000030;
  Kind in_stack_00000274;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_00000278;
  Decoder *in_stack_000002c8;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_000002d0;
  
  SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance(in_stack_00000278,in_stack_00000274)
  ;
  pDVar2 = boost::shared_ptr<avro::Decoder>::operator->((shared_ptr<avro::Decoder> *)(in_RDI + 8));
  iVar1 = (*pDVar2->_vptr_Decoder[0x15])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::pop
              ((SimpleParser<avro::parsing::ResolvingDecoderHandler> *)0x2141f6);
  }
  else {
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::setRepeatCount
              (in_stack_00000030,in_stack_00000028);
    boost::shared_ptr<avro::Decoder>::operator*((shared_ptr<avro::Decoder> *)(in_RDI + 8));
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::skip(in_stack_000002d0,in_stack_000002c8);
  }
  SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance(in_stack_00000278,in_stack_00000274)
  ;
  return 0;
}

Assistant:

size_t ResolvingDecoderImpl<P>::skipMap()
{
    parser_.advance(Symbol::sMapStart);
    size_t n = base_->skipMap();
    if (n == 0) {
        parser_.pop();
    } else {
        parser_.setRepeatCount(n);
        parser_.skip(*base_);
    }
    parser_.advance(Symbol::sMapEnd);
    return 0;
}